

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall
detail::sizer::operator()(sizer *this,optional_field<example::exercise_t,_0UL> *param_1)

{
  size_t sVar1;
  reference_type pbVar2;
  undefined8 uVar3;
  ulong uVar4;
  
  if ((this->opts_).super_type.m_initialized != false) {
    pbVar2 = boost::optional<std::bitset<16UL>_>::get(&this->opts_);
    if (((pbVar2->super__Base_bitset<1UL>)._M_w & 1) != 0) {
      sVar1 = (this->buf_).size_;
      uVar4 = (ulong)(sVar1 != 0);
      (this->buf_).data_ = (void *)((long)(this->buf_).data_ + uVar4);
      (this->buf_).size_ = sVar1 - uVar4;
    }
    return;
  }
  uVar3 = __cxa_allocate_exception(0x40);
  bad_message();
  __cxa_throw(uVar3,&boost::system::system_error::typeinfo,
              boost::system::system_error::~system_error);
}

Assistant:

void operator()(example::optional_field<T, N> const&) const {
        if (!opts_)
            throw bad_message();
        if ((*opts_)[N]) {
            T v;
            (*this)(v);
        }
    }